

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

void __thiscall TokenField::saveXml(TokenField *this,ostream *s)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<tokenfield",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(s," bigendian=\"",0xc);
  if (this->bigendian == true) {
    pcVar3 = "true\"";
    lVar2 = 5;
  }
  else {
    pcVar3 = "false\"";
    lVar2 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(s," signbit=\"",10);
  if (this->signbit == true) {
    pcVar3 = "true\"";
    lVar2 = 5;
  }
  else {
    pcVar3 = "false\"";
    lVar2 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(s," bitstart=\"",0xb);
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(s,this->bitstart);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," bitend=\"",9);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->bitend);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," bytestart=\"",0xc);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->bytestart);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," byteend=\"",10);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->byteend);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," shift=\"",8);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->shift);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"/>\n",4);
  return;
}

Assistant:

void TokenField::saveXml(ostream &s) const

{
  s << "<tokenfield";
  s << " bigendian=\"";
  if (bigendian)
    s << "true\"";
  else
    s << "false\"";
  s << " signbit=\"";
  if (signbit)
    s << "true\"";
  else
    s << "false\"";
  s << " bitstart=\"" << dec << bitstart << "\"";
  s << " bitend=\"" << bitend << "\"";
  s << " bytestart=\"" << bytestart << "\"";
  s << " byteend=\"" << byteend << "\"";
  s << " shift=\"" << shift << "\"/>\n";
}